

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_baaa9c::handleSystemIncludesDep
               (cmLocalGenerator *lg,cmGeneratorTarget *depTgt,string *config,
               cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result,bool excludeImported,string *language)

{
  bool bVar1;
  string *psVar2;
  string local_1a0;
  string local_180;
  string_view local_160;
  allocator<char> local_149;
  string local_148;
  cmValue local_128;
  cmValue dirs_1;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  string_view local_90;
  allocator<char> local_69;
  string local_68;
  cmValue local_48;
  cmValue dirs;
  bool excludeImported_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmGeneratorTarget *depTgt_local;
  cmLocalGenerator *lg_local;
  
  dirs.Value._7_1_ = excludeImported;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_69);
  local_48 = cmGeneratorTarget::GetProperty(depTgt,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = cmValue::operator_cast_to_bool(&local_48);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_48);
    std::__cxx11::string::string((string *)&local_d0,(string *)psVar2);
    cmGeneratorExpression::Evaluate
              (&local_b0,&local_d0,lg,config,headTarget,dagChecker,depTgt,language);
    local_90 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
    cmExpandList(local_90,result,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"SYSTEM",&local_f1);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(depTgt,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return;
  }
  bVar1 = cmGeneratorTarget::IsImported(depTgt);
  if (bVar1) {
    if ((dirs.Value._7_1_ & 1) != 0) {
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"IMPORTED_NO_SYSTEM",
               (allocator<char> *)((long)&dirs_1.Value + 7));
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(depTgt,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirs_1.Value + 7));
    if (bVar1) {
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"INTERFACE_INCLUDE_DIRECTORIES",&local_149);
  local_128 = cmGeneratorTarget::GetProperty(depTgt,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  bVar1 = cmValue::operator_cast_to_bool(&local_128);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_128);
    std::__cxx11::string::string((string *)&local_1a0,(string *)psVar2);
    cmGeneratorExpression::Evaluate
              (&local_180,&local_1a0,lg,config,headTarget,dagChecker,depTgt,language);
    local_160 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_180);
    cmExpandList(local_160,result,false);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return;
}

Assistant:

void handleSystemIncludesDep(cmLocalGenerator* lg,
                             cmGeneratorTarget const* depTgt,
                             const std::string& config,
                             cmGeneratorTarget const* headTarget,
                             cmGeneratorExpressionDAGChecker* dagChecker,
                             std::vector<std::string>& result,
                             bool excludeImported, std::string const& language)
{
  if (cmValue dirs =
        depTgt->GetProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(*dirs, lg, config, headTarget,
                                                 dagChecker, depTgt, language),
                 result);
  }
  if (!depTgt->GetPropertyAsBool("SYSTEM")) {
    return;
  }
  if (depTgt->IsImported()) {
    if (excludeImported) {
      return;
    }
    if (depTgt->GetPropertyAsBool("IMPORTED_NO_SYSTEM")) {
      return;
    }
  }

  if (cmValue dirs = depTgt->GetProperty("INTERFACE_INCLUDE_DIRECTORIES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(*dirs, lg, config, headTarget,
                                                 dagChecker, depTgt, language),
                 result);
  }
}